

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O1

Vector __thiscall Vector::ProjectPlane(Vector *this,Vector *right,Vector *up)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector VVar9;
  
  fVar1 = right->m_vec[0];
  fVar2 = right->m_vec[1];
  fVar3 = right->m_vec[2];
  fVar8 = (fVar3 * this->m_vec[2] + fVar2 * this->m_vec[1] + fVar1 * this->m_vec[0]) /
          (fVar3 * fVar3 + fVar2 * fVar2 + fVar1 * fVar1);
  fVar4 = up->m_vec[0];
  fVar5 = up->m_vec[1];
  fVar6 = up->m_vec[2];
  fVar7 = (this->m_vec[2] * fVar6 + this->m_vec[1] * fVar5 + this->m_vec[0] * fVar4) /
          (fVar6 * fVar6 + fVar5 * fVar5 + fVar4 * fVar4);
  VVar9.m_vec[0] = fVar4 * fVar7 + fVar1 * fVar8;
  VVar9.m_vec[1] = fVar5 * fVar7 + fVar2 * fVar8;
  VVar9.m_length = -1.0;
  VVar9.m_vec[2] = fVar7 * fVar6 + fVar8 * fVar3;
  return VVar9;
}

Assistant:

float X() const { return m_vec[0]; }